

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::RoaringScanState::RoaringScanState(RoaringScanState *this,ColumnSegment *segment)

{
  BufferHandle *this_00;
  ulong uVar1;
  ContainerMetadataCollection *collection;
  BufferManager *pBVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  idx_t container_count;
  bool bVar5;
  ContainerMetadata metadata;
  idx_t position;
  ContainerMetadataCollectionScanner scanner;
  ContainerMetadata local_74;
  value_type_conflict2 local_70;
  ContainerMetadataCollection *local_68;
  BufferHandle *local_60;
  RoaringScanState *local_58;
  ContainerMetadataCollectionScanner local_50;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__RoaringScanState_01789018;
  this_00 = &this->handle;
  BufferHandle::BufferHandle(this_00);
  this->segment = segment;
  (this->current_container).
  super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
       (ContainerScanState *)0x0;
  local_60 = this_00;
  local_58 = this;
  ContainerMetadataCollection::ContainerMetadataCollection(&this->metadata_collection);
  (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->container_metadata).
  super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  .
  super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->container_metadata).
  super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  .
  super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container_metadata).
  super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  .
  super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = &this->metadata_collection;
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&local_50,pBVar2,&segment->block);
  BufferHandle::operator=(this_00,(BufferHandle *)&local_50);
  BufferHandle::~BufferHandle((BufferHandle *)&local_50);
  pdVar3 = BufferHandle::Ptr(this_00);
  collection = local_68;
  iVar4 = segment->offset;
  this->data_ptr = pdVar3 + iVar4 + 8;
  uVar1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  container_count = ((uVar1 >> 0xb) + 1) - (ulong)((uVar1 & 0x7ff) == 0);
  ContainerMetadataCollection::Deserialize
            (local_68,pdVar3 + iVar4 + 8 + *(long *)(pdVar3 + iVar4),container_count);
  ContainerMetadataCollectionScanner::ContainerMetadataCollectionScanner(&local_50,collection);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->data_start_position,
             container_count);
  local_70 = 0;
  while (bVar5 = container_count != 0, container_count = container_count - 1, bVar5) {
    local_74 = ContainerMetadataCollectionScanner::GetNext(&local_50);
    ::std::
    vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
    ::push_back(&(this->container_metadata).
                 super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                ,&local_74);
    if (local_74.container_type == RUN_CONTAINER) {
      if (local_74.count < 4) {
        local_70 = local_70 + 3 & 0xfffffffffffffffc;
      }
    }
    else if (((uint)local_74 & 0xff) == 1) {
      if (local_74.count < 8) {
        local_70 = local_70 + 1 & 0xfffffffffffffffe;
      }
    }
    else if (((uint)local_74 & 0xff) == 2) {
      local_70 = local_70 + 7 & 0xfffffffffffffff8;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->data_start_position,
               &local_70);
    iVar4 = ContainerMetadata::GetDataSizeInBytes(&local_74,0x800);
    local_70 = local_70 + iVar4;
  }
  return;
}

Assistant:

RoaringScanState::RoaringScanState(ColumnSegment &segment) : segment(segment) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	handle = buffer_manager.Pin(segment.block);
	auto base_ptr = handle.Ptr() + segment.GetBlockOffset();
	data_ptr = base_ptr + sizeof(idx_t);

	// Deserialize the container metadata for this segment
	auto metadata_offset = Load<idx_t>(base_ptr);
	auto metadata_ptr = data_ptr + metadata_offset;

	auto segment_count = segment.count.load();
	auto container_count = segment_count / ROARING_CONTAINER_SIZE;
	if (segment_count % ROARING_CONTAINER_SIZE != 0) {
		container_count++;
	}
	metadata_collection.Deserialize(metadata_ptr, container_count);
	ContainerMetadataCollectionScanner scanner(metadata_collection);
	data_start_position.reserve(container_count);
	idx_t position = 0;
	for (idx_t i = 0; i < container_count; i++) {
		auto metadata = scanner.GetNext();
		container_metadata.push_back(metadata);
		if (metadata.IsUncompressed()) {
			position = AlignValue<idx_t>(position);
		} else if (metadata.IsArray() && metadata.Cardinality() < COMPRESSED_ARRAY_THRESHOLD) {
			position = AlignValue<idx_t, sizeof(uint16_t)>(position);
		} else if (metadata.IsRun() && metadata.NumberOfRuns() < COMPRESSED_RUN_THRESHOLD) {
			position = AlignValue<idx_t, sizeof(RunContainerRLEPair)>(position);
		}
		data_start_position.push_back(position);
		position += SkipVector(metadata);
	}
}